

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined8 uVar110;
  ulong uVar111;
  secp256k1_fe *psVar112;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar113;
  ulong uVar114;
  ulong uVar115;
  secp256k1_fe *psVar116;
  undefined8 unaff_RBP;
  secp256k1_fe *a_01;
  secp256k1_ge *psVar117;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar118;
  secp256k1_fe *psVar119;
  secp256k1_fe *psVar120;
  secp256k1_ge *psVar121;
  secp256k1_ge *r_00;
  secp256k1_ge *a_03;
  undefined8 unaff_R12;
  ulong uVar122;
  ulong unaff_R13;
  ulong unaff_R14;
  ulong uVar123;
  undefined1 auStack_1e0 [56];
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  undefined8 uStack_188;
  int iStack_184;
  secp256k1_fe *psStack_180;
  secp256k1_ge *psStack_178;
  code *pcStack_170;
  secp256k1_ge_storage sStack_168;
  undefined8 uStack_128;
  code *pcStack_118;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  secp256k1_ge *psStack_f0;
  ulong uStack_e8;
  secp256k1_fe *psStack_e0;
  ulong uStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_fe *psStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  secp256k1_fe *psStack_b0;
  undefined1 auStack_a8 [16];
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong uStack_80;
  undefined1 auStack_78 [16];
  ulong local_68;
  secp256k1_fe *local_60;
  ulong local_58;
  secp256k1_fe *local_50;
  secp256k1_fe *local_48;
  long local_40;
  ulong local_38;
  
  auVar96._8_8_ = unaff_R12;
  auVar96._0_8_ = unaff_RBP;
  auStack_78._8_8_ = 0x140efe;
  secp256k1_fe_verify(a);
  a_01 = (secp256k1_fe *)0x8;
  auStack_78._8_8_ = 0x140f0b;
  psVar116 = a;
  secp256k1_fe_verify_magnitude(a,8);
  psVar120 = (secp256k1_fe *)a->n[0];
  if ((ulong)psVar120 >> 0x38 == 0) {
    psVar116 = (secp256k1_fe *)a->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < psVar116) goto LAB_001412e0;
    unaff_R14 = a->n[2];
    if (0xffffffffffffff < unaff_R14) goto LAB_001412e5;
    psVar113 = (secp256k1_fe *)a->n[3];
    if ((secp256k1_fe *)0xffffffffffffff < psVar113) goto LAB_001412ea;
    uVar122 = a->n[4];
    if (uVar122 >> 0x34 != 0) goto LAB_001412ef;
    local_38 = (long)psVar120 * 2;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = psVar113;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_38;
    a_01 = (secp256k1_fe *)((long)psVar116 * 2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = unaff_R14;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = a_01;
    auVar96 = auVar3 * auVar54 + auVar2 * auVar53;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar122;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar122;
    uVar111 = SUB168(auVar4 * auVar55,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = SUB168(auVar4 * auVar55,0);
    auVar2 = auVar96 + auVar5 * ZEXT816(0x1000003d10);
    unaff_R13 = auVar2._8_8_;
    a = psVar120;
    if (unaff_R13 >> 0x33 != 0) goto LAB_001412f4;
    auVar109 = auVar2 >> 0x34;
    psVar119 = auVar109._0_8_;
    local_58 = uVar122 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_58;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = psVar120;
    auVar6 = auVar6 * auVar56;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = psVar113;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = a_01;
    a = SUB168(auVar7 * auVar57,8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_R14;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = unaff_R14;
    auVar3 = auVar6 + auVar8 * auVar58 + auVar7 * auVar57;
    uVar122 = SUB168(auVar3 + (auVar2 >> 0x34),8);
    auVar96._8_8_ = uVar122;
    auVar96._0_8_ = auVar6._0_8_;
    psVar112 = auVar6._8_8_;
    local_68 = uVar111;
    local_60 = psVar120;
    local_50 = r;
    local_48 = psVar116;
    if (0x7ffffffffffff < uVar122) goto LAB_001412f9;
    local_40 = 0x7ffffffffffff;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar111;
    auVar3 = auVar9 * ZEXT816(0x1000003d10000) + auVar3 + (auVar2 >> 0x34);
    auVar96._8_8_ = SUB168(auVar3 >> 0x34,0);
    a_01 = SUB168(auVar3 >> 0x34,8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_58;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = psVar116;
    psVar112 = SUB168(auVar10 * auVar59,8);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = psVar113;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = unaff_R14 * 2;
    auVar97 = auVar11 * auVar60 + auVar10 * auVar59 + (auVar3 >> 0x34);
    uVar122 = unaff_R14;
    if (auVar97._8_8_ >> 0x32 != 0) goto LAB_001412fe;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = psVar120;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = psVar120;
    uVar110 = SUB168(auVar12 * auVar61,0);
    uVar111 = auVar97._8_8_ >> 0x34;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (auVar97._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
    auVar98 = auVar13 * ZEXT816(0x1000003d1) + auVar12 * auVar61;
    psVar119 = (secp256k1_fe *)(auVar98._0_8_ & 0xfffffffffffff);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_58;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = unaff_R14;
    psVar112 = SUB168(auVar14 * auVar62,8);
    r->n[0] = (uint64_t)psVar119;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = psVar113;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = psVar113;
    a_01 = (secp256k1_fe *)0x3ffffffffffff;
    auVar96 = auVar15 * auVar63 + auVar14 * auVar62 + (auVar97 >> 0x34);
    uVar122 = auVar96._0_8_;
    local_68 = unaff_R14;
    local_60 = psVar113;
    if (0x3ffffffffffff < auVar96._8_8_) goto LAB_00141303;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = psVar116;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_38;
    psVar112 = SUB168(auVar16 * auVar64,8);
    auVar98 = auVar98 >> 0x34;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar122 & 0xfffffffffffff;
    auVar99 = auVar17 * ZEXT816(0x1000003d10) + auVar16 * auVar64 + auVar98;
    local_40 = 0x7ffffffffffff - auVar99._8_8_;
    psVar119 = psVar116;
    if (0x7ffffffffffff < auVar99._8_8_) goto LAB_00141308;
    uVar110 = SUB168(auVar99 >> 0x34,0);
    uVar123 = auVar99._0_8_ & 0xfffffffffffff;
    auVar102._8_8_ = SUB168(auVar99 >> 0x34,8);
    auVar102._0_8_ = uVar123;
    auVar5 = auVar99 >> 0x34;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = unaff_R14;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_38;
    auVar93 = auVar18 * auVar65;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = psVar116;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = psVar116;
    auVar4 = auVar19 * auVar66 + auVar93;
    uVar111 = SUB168(auVar4 + auVar5,8);
    r->n[1] = uVar123;
    a_01 = (secp256k1_fe *)(0x3ffffffffffff - uVar111);
    auVar99 = auVar102;
    if (0x3ffffffffffff < uVar111) goto LAB_0014130d;
    uVar122 = uVar122 >> 0x34 | auVar96._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_58;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = psVar113;
    auVar96 = auVar20 * auVar67 + (auVar96 >> 0x34);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar96._0_8_;
    auVar4 = auVar21 * ZEXT816(0x1000003d10) + auVar4 + auVar5;
    r->n[2] = auVar4._0_8_ & 0xfffffffffffff;
    auVar4 = auVar4 >> 0x34;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auVar4._0_8_;
    a_01 = auVar4._8_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar96._8_8_;
    auVar100._8_8_ = a_01;
    auVar100._0_8_ = auVar2._0_8_ & 0xffffffffffffe;
    auVar101 = auVar22 * ZEXT816(0x1000003d10000) + auVar100 + auVar101;
    uVar111 = auVar101._0_8_;
    uVar123 = auVar101._8_8_;
    if (uVar123 >> 0x24 != 0) goto LAB_00141312;
    r->n[3] = uVar111 & 0xfffffffffffff;
    uVar111 = (uVar123 << 0xc | uVar111 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
    r->n[4] = uVar111;
    if (uVar111 >> 0x31 == 0) {
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    auStack_78._8_8_ = 0x1412e0;
    secp256k1_fe_sqr_cold_13();
LAB_001412e0:
    auStack_78._8_8_ = 0x1412e5;
    secp256k1_fe_sqr_cold_12();
LAB_001412e5:
    auStack_78._8_8_ = 0x1412ea;
    secp256k1_fe_sqr_cold_11();
LAB_001412ea:
    auStack_78._8_8_ = 0x1412ef;
    secp256k1_fe_sqr_cold_10();
LAB_001412ef:
    auStack_78._8_8_ = 0x1412f4;
    secp256k1_fe_sqr_cold_9();
LAB_001412f4:
    auStack_78._8_8_ = 0x1412f9;
    secp256k1_fe_sqr_cold_8();
    auVar109._8_8_ = unaff_R13;
    auVar109._0_8_ = psVar116;
    psVar112 = r;
LAB_001412f9:
    psVar119 = auVar109._0_8_;
    auVar97._8_8_ = a;
    auVar97._0_8_ = auVar109._8_8_;
    auStack_78._8_8_ = 0x1412fe;
    secp256k1_fe_sqr_cold_7();
    uVar122 = unaff_R14;
LAB_001412fe:
    uVar110 = auVar96._0_8_;
    uVar111 = auVar97._8_8_;
    auVar98._8_8_ = auVar96._8_8_;
    auVar98._0_8_ = auVar97._0_8_;
    auStack_78._8_8_ = 0x141303;
    secp256k1_fe_sqr_cold_6();
LAB_00141303:
    auVar99._8_8_ = uVar110;
    auVar99._0_8_ = uVar111;
    auStack_78._8_8_ = 0x141308;
    secp256k1_fe_sqr_cold_5();
LAB_00141308:
    r = psVar119;
    uVar110 = auVar98._0_8_;
    auVar93._8_8_ = psVar112;
    auVar93._0_8_ = auVar98._8_8_;
    auStack_78._8_8_ = 0x14130d;
    secp256k1_fe_sqr_cold_4();
LAB_0014130d:
    auStack_78._8_8_ = 0x141312;
    secp256k1_fe_sqr_cold_3();
LAB_00141312:
    auStack_78._8_8_ = 0x141317;
    secp256k1_fe_sqr_cold_2();
  }
  uVar111 = auVar99._8_8_;
  uVar123 = auVar99._0_8_;
  auStack_78._8_8_ = secp256k1_fe_mul;
  secp256k1_fe_sqr_cold_1();
  pcStack_118 = (code *)0x14133b;
  uStack_98 = auVar93._8_8_;
  uStack_90 = auVar93._0_8_;
  uStack_88 = uVar110;
  uStack_80 = uVar122;
  auStack_78 = auVar99;
  secp256k1_fe_verify(a_01);
  pcStack_118 = (code *)0x141343;
  secp256k1_fe_verify(a_00);
  pcStack_118 = (code *)0x141350;
  secp256k1_fe_verify_magnitude(a_01,8);
  psVar117 = (secp256k1_ge *)0x8;
  pcStack_118 = (code *)0x14135d;
  psVar120 = a_00;
  secp256k1_fe_verify_magnitude(a_00,8);
  if (r == a_00) {
    pcStack_118 = (code *)0x141857;
    secp256k1_fe_mul_cold_21();
LAB_00141857:
    pcStack_118 = (code *)0x14185c;
    secp256k1_fe_mul_cold_20();
LAB_0014185c:
    pcStack_118 = (code *)0x141861;
    secp256k1_fe_mul_cold_19();
LAB_00141861:
    pcStack_118 = (code *)0x141866;
    secp256k1_fe_mul_cold_18();
LAB_00141866:
    pcStack_118 = (code *)0x14186b;
    secp256k1_fe_mul_cold_17();
LAB_0014186b:
    pcStack_118 = (code *)0x141870;
    secp256k1_fe_mul_cold_16();
LAB_00141870:
    pcStack_118 = (code *)0x141875;
    secp256k1_fe_mul_cold_15();
LAB_00141875:
    pcStack_118 = (code *)0x14187a;
    secp256k1_fe_mul_cold_14();
LAB_0014187a:
    pcStack_118 = (code *)0x14187f;
    secp256k1_fe_mul_cold_13();
LAB_0014187f:
    pcStack_118 = (code *)0x141884;
    secp256k1_fe_mul_cold_12();
LAB_00141884:
    pcStack_118 = (code *)0x141889;
    secp256k1_fe_mul_cold_11();
    a_02 = psVar117;
LAB_00141889:
    psVar116 = a_01;
    pcStack_118 = (code *)0x14188e;
    secp256k1_fe_mul_cold_10();
    auVar94._8_8_ = uVar111;
    auVar94._0_8_ = psVar120;
LAB_0014188e:
    auVar95._8_8_ = psVar116;
    auVar95._0_8_ = auVar94._8_8_;
    psVar113 = auVar94._0_8_;
    pcStack_118 = (code *)0x141893;
    secp256k1_fe_mul_cold_9();
LAB_00141893:
    pcStack_118 = (code *)0x141898;
    secp256k1_fe_mul_cold_8();
LAB_00141898:
    r = psVar113;
    pcStack_118 = (code *)0x14189d;
    secp256k1_fe_mul_cold_7();
LAB_0014189d:
    pcStack_118 = (code *)0x1418a2;
    secp256k1_fe_mul_cold_6();
LAB_001418a2:
    pcStack_118 = (code *)0x1418a7;
    secp256k1_fe_mul_cold_5();
LAB_001418a7:
    pcStack_118 = (code *)0x1418ac;
    secp256k1_fe_mul_cold_4();
LAB_001418ac:
    pcStack_118 = (code *)0x1418b1;
    secp256k1_fe_mul_cold_3();
LAB_001418b1:
    pcStack_118 = (code *)0x1418b6;
    secp256k1_fe_mul_cold_2();
  }
  else {
    if (a_01 == a_00) goto LAB_00141857;
    psVar116 = (secp256k1_fe *)a_01->n[0];
    if ((ulong)psVar116 >> 0x38 != 0) goto LAB_0014185c;
    uVar123 = 0xffffffffffffff;
    uVar122 = a_01->n[1];
    if (0xffffffffffffff < uVar122) goto LAB_00141861;
    psVar117 = (secp256k1_ge *)a_01->n[2];
    if ((secp256k1_ge *)0xffffffffffffff < psVar117) goto LAB_00141866;
    uVar1 = a_01->n[3];
    if (0xffffffffffffff < uVar1) goto LAB_0014186b;
    uStack_e8 = a_01->n[4];
    if (uStack_e8 >> 0x34 != 0) goto LAB_00141870;
    uVar115 = a_00->n[0];
    if (0xffffffffffffff < uVar115) goto LAB_00141875;
    a_01 = (secp256k1_fe *)a_00->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < a_01) goto LAB_0014187a;
    uVar114 = a_00->n[2];
    if (0xffffffffffffff < uVar114) goto LAB_0014187f;
    psVar120 = (secp256k1_fe *)a_00->n[3];
    if ((secp256k1_fe *)0xffffffffffffff < psVar120) goto LAB_00141884;
    uVar111 = a_00->n[4];
    a_02 = psVar117;
    if (0xfffffffffffff < uVar111) goto LAB_00141889;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = psVar120;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = psVar116;
    auVar94 = auVar23 * auVar68;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar114;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar122;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = a_01;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = psVar117;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar115;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar1;
    auVar96 = auVar94 + auVar24 * auVar69 + auVar26 * auVar71 + auVar25 * auVar70;
    a_02 = auVar96._8_8_;
    uStack_108 = uVar114;
    uStack_100 = uVar111;
    uStack_f8 = uVar122;
    psStack_f0 = psVar117;
    uStack_d8 = uVar115;
    psStack_d0 = a_01;
    psStack_c8 = psVar120;
    psStack_b0 = r;
    if ((ulong)a_02 >> 0x32 != 0) goto LAB_0014188e;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar111;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uStack_e8;
    uStack_b8 = SUB168(auVar27 * auVar72,8);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = SUB168(auVar27 * auVar72,0);
    auVar96 = auVar96 + auVar28 * ZEXT816(0x1000003d10);
    uStack_c0 = auVar96._0_8_;
    auVar96 = auVar96 >> 0x34;
    auStack_a8._8_8_ = 0;
    auStack_a8._0_8_ = uVar111;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = psVar116;
    auStack_a8 = auStack_a8 * auVar73;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = psVar120;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar122;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar114;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = psVar117;
    auVar95 = auVar30 * auVar75;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = a_01;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar1;
    psVar113 = SUB168(auVar31 * auVar76,8);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar115;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uStack_e8;
    auVar2 = auVar29 * auVar74 + auVar95 + auVar32 * auVar77 + auVar31 * auVar76;
    auVar3 = auStack_a8 + auVar2;
    a_02 = (secp256k1_ge *)
           (auVar3._8_8_ + auVar96._8_8_ + (ulong)CARRY8(auVar3._0_8_,auVar96._0_8_));
    psStack_e0 = psVar116;
    if ((ulong)a_02 >> 0x33 != 0) goto LAB_00141893;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uStack_b8;
    auVar96 = auVar33 * ZEXT816(0x1000003d10000) + auVar96 + auVar2 + auStack_a8;
    auVar2 = auVar96 >> 0x34;
    a_02 = auVar2._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar111;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar122;
    uStack_100 = SUB168(auVar34 * auVar78,8);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = psVar120;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = psVar117;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar114;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = a_01;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uStack_e8;
    auVar3 = auVar2 + auVar35 * auVar79 + auVar37 * auVar81 + auVar36 * auVar80 + auVar34 * auVar78;
    uVar114 = auVar3._0_8_;
    auVar95._8_8_ = uVar114;
    auVar95._0_8_ = auVar2._8_8_;
    uVar111 = auVar3._8_8_;
    psVar113 = SUB168(auVar35 * auVar79,0);
    uStack_108 = uVar1;
    if (0x3ffffffffffff < uVar111) goto LAB_00141898;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar115;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = psVar116;
    uVar123 = uVar114 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar96._6_2_ & 0xf);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar123;
    auVar2 = auVar38 * auVar82 + auVar39 * ZEXT816(0x1000003d1);
    r->n[0] = auVar2._0_8_ & 0xfffffffffffff;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = psVar116;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = a_00->n[1];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar122;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = a_00->n[0];
    auVar2 = auVar40 * auVar83 + (auVar2 >> 0x34) + auVar41 * auVar84;
    a_02 = auVar2._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_02) goto LAB_0014189d;
    auVar103._8_8_ = uVar111 >> 0x34;
    auVar103._0_8_ = uVar114 >> 0x34 | uVar111 << 0xc;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = psVar117;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = a_00->n[4];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar1;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = a_00->n[3];
    auVar3 = auVar42 * auVar85 + auVar103 + auVar43 * auVar86;
    uVar123 = auVar3._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_e8;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = a_00->n[2];
    auVar3 = auVar3 + auVar44 * auVar87;
    uVar115 = auVar3._0_8_;
    auVar95._8_8_ = uVar115;
    auVar95._0_8_ = uStack_e8;
    uVar111 = auVar3._8_8_;
    if (0x3ffffffffffff < uVar111) goto LAB_001418a2;
    uVar123 = 0xfffffffffffff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar115 & 0xfffffffffffff;
    auVar2 = auVar2 + auVar45 * ZEXT816(0x1000003d10);
    r->n[1] = auVar2._0_8_ & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = psVar116;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = a_00->n[2];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar122;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_00->n[1];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = psVar117;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = a_00->n[0];
    auVar2 = auVar47 * auVar89 + auVar46 * auVar88 + (auVar2 >> 0x34) + auVar48 * auVar90;
    a_02 = auVar2._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_02) goto LAB_001418a7;
    uVar122 = uVar115 >> 0x34 | uVar111 << 0xc;
    auVar108._8_8_ = uVar122;
    auVar108._0_8_ = uStack_e8;
    auVar107._8_8_ = uVar122;
    auVar107._0_8_ = uStack_e8;
    auVar95._8_8_ = uVar122;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = a_00->n[4];
    auVar104._8_8_ = uVar111 >> 0x34;
    auVar104._0_8_ = uVar122;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uStack_e8;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = a_00->n[3];
    auVar3 = auVar49 * auVar91 + auVar104 + auVar50 * auVar92;
    uVar122 = auVar3._8_8_;
    if (0x3ffffffffffff < uVar122) goto LAB_001418ac;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auVar3._0_8_;
    auVar2 = auVar2 + auVar51 * ZEXT816(0x1000003d10);
    auVar3 = auVar2 >> 0x34;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = auVar3._0_8_;
    r->n[2] = auVar2._0_8_ & 0xfffffffffffff;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar122;
    a_02 = auVar3._8_8_;
    auVar105._8_8_ = a_02;
    auVar105._0_8_ = uStack_c0 & 0xfffffffffffff;
    auVar106 = auVar52 * ZEXT816(0x1000003d10000) + auVar105 + auVar106;
    uVar122 = auVar106._0_8_;
    uVar111 = auVar106._8_8_;
    auVar95 = auVar107;
    if (uVar111 >> 0x24 != 0) goto LAB_001418b1;
    uVar123 = uVar122 & 0xfffffffffffff;
    r->n[3] = uVar123;
    uVar122 = (uVar111 << 0xc | uVar122 >> 0x34) + (auVar96._0_8_ & 0xffffffffffff);
    r->n[4] = uVar122;
    auVar95 = auVar108;
    if (uVar122 >> 0x31 == 0) {
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  pcStack_118 = secp256k1_ge_to_bytes;
  secp256k1_fe_mul_cold_1();
  pcStack_170 = (code *)0x1418d2;
  psVar117 = a_02;
  psVar121 = a_02;
  uStack_128 = auVar95._8_8_;
  pcStack_118 = (code *)uVar123;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    pcStack_170 = (code *)0x1418e7;
    secp256k1_ge_to_storage(&sStack_168,a_02);
    r[1].n[0] = sStack_168.y.n[2];
    r[1].n[1] = sStack_168.y.n[3];
    r->n[4] = sStack_168.y.n[0];
    r->magnitude = (undefined4)sStack_168.y.n[1];
    r->normalized = sStack_168.y.n[1]._4_4_;
    r->n[2] = sStack_168.x.n[2];
    r->n[3] = sStack_168.x.n[3];
    r->n[0] = sStack_168.x.n[0];
    r->n[1] = sStack_168.x.n[1];
    return;
  }
  pcStack_170 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_03 = (secp256k1_ge *)auStack_1e0;
  psVar118 = psVar117;
  r_00 = psVar117;
  psStack_180 = r;
  psStack_178 = a_02;
  pcStack_170 = (code *)uVar123;
  secp256k1_ge_verify(psVar117);
  if (psVar117->infinity == 0) {
    auStack_1e0._48_8_ = (psVar117->x).n[0];
    uStack_1a8 = (psVar117->x).n[1];
    uStack_1a0 = (psVar117->x).n[2];
    uStack_198 = (psVar117->x).n[3];
    uStack_190 = (psVar117->x).n[4];
    uStack_188._0_4_ = (psVar117->x).magnitude;
    iStack_184 = (psVar117->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_1e0 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_1e0._0_8_ = (psVar117->y).n[0];
    auStack_1e0._8_8_ = (psVar117->y).n[1];
    auStack_1e0._16_8_ = (psVar117->y).n[2];
    auStack_1e0._24_8_ = (psVar117->y).n[3];
    auStack_1e0._32_8_ = (psVar117->y).n[4];
    auStack_1e0._40_4_ = (psVar117->y).magnitude;
    auStack_1e0._44_4_ = (psVar117->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_1e0);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_184 != 0) {
      (psVar121->x).n[0] = uStack_1a8 << 0x34 | auStack_1e0._48_8_;
      (psVar121->x).n[1] = uStack_1a0 << 0x28 | uStack_1a8 >> 0xc;
      (psVar121->x).n[2] = uStack_198 << 0x1c | uStack_1a0 >> 0x18;
      (psVar121->x).n[3] = uStack_190 << 0x10 | uStack_198 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
      if (auStack_1e0._44_4_ != 0) {
        (psVar121->x).n[4] = auStack_1e0._8_8_ << 0x34 | auStack_1e0._0_8_;
        uVar122 = auStack_1e0._16_8_ << 0x28 | (ulong)auStack_1e0._8_8_ >> 0xc;
        (psVar121->x).magnitude = (int)uVar122;
        (psVar121->x).normalized = (int)(uVar122 >> 0x20);
        (psVar121->y).n[0] = auStack_1e0._24_8_ << 0x1c | (ulong)auStack_1e0._16_8_ >> 0x18;
        (psVar121->y).n[1] = auStack_1e0._32_8_ << 0x10 | (ulong)auStack_1e0._24_8_ >> 0x24;
        return;
      }
      goto LAB_00141a6a;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_03 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_00141a6a:
  secp256k1_ge_to_storage_cold_2();
  (a_03->x).n[0] = (psVar118->x).n[0] & 0xfffffffffffff;
  (a_03->x).n[1] = ((psVar118->x).n[1] & 0xffffffffff) << 0xc | (psVar118->x).n[0] >> 0x34;
  (a_03->x).n[2] = ((psVar118->x).n[2] & 0xfffffff) << 0x18 | (psVar118->x).n[1] >> 0x28;
  (a_03->x).n[3] = ((psVar118->x).n[3] & 0xffff) << 0x24 | (psVar118->x).n[2] >> 0x1c;
  (a_03->x).n[4] = (psVar118->x).n[3] >> 0x10;
  (a_03->x).magnitude = 1;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).n[0] = (psVar118->x).n[4] & 0xfffffffffffff;
  uVar122._0_4_ = (psVar118->x).magnitude;
  uVar122._4_4_ = (psVar118->x).normalized;
  (a_03->y).n[1] = (uVar122 & 0xffffffffff) << 0xc | (psVar118->x).n[4] >> 0x34;
  uVar111._0_4_ = (psVar118->x).magnitude;
  uVar111._4_4_ = (psVar118->x).normalized;
  (a_03->y).n[2] = ((psVar118->y).n[0] & 0xfffffff) << 0x18 | uVar111 >> 0x28;
  (a_03->y).n[3] = ((psVar118->y).n[1] & 0xffff) << 0x24 | (psVar118->y).n[0] >> 0x1c;
  (a_03->y).n[4] = (psVar118->y).n[1] >> 0x10;
  (a_03->y).magnitude = 1;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  a_03->infinity = 0;
  secp256k1_ge_verify(a_03);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);

    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}